

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParseHelper.cpp
# Opt level: O2

TSymbol * __thiscall
glslang::TParseContext::redeclareBuiltinVariable
          (TParseContext *this,TSourceLoc *loc,TString *identifier,TQualifier *qualifier,
          TShaderQualifiers *publicType)

{
  EShLanguage EVar1;
  TLayoutDepth TVar2;
  TLayoutStencil TVar3;
  TSymbolTable *pTVar4;
  bool bVar5;
  bool bVar6;
  bool bVar7;
  char cVar8;
  int iVar9;
  undefined4 extraout_var;
  long lVar10;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  ulong uVar11;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  undefined4 extraout_var_05;
  ulong uVar12;
  undefined4 extraout_var_06;
  undefined4 extraout_var_07;
  undefined4 extraout_var_08;
  undefined4 extraout_var_09;
  TIntermediate *pTVar13;
  undefined4 extraout_var_10;
  undefined4 extraout_var_11;
  undefined4 extraout_var_12;
  undefined4 extraout_var_13;
  ulong uVar14;
  undefined4 extraout_var_14;
  undefined4 extraout_var_15;
  undefined4 extraout_var_16;
  undefined4 extraout_var_17;
  undefined4 extraout_var_18;
  undefined4 extraout_var_19;
  char *pcVar15;
  TSourceLoc *pTVar16;
  undefined8 uVar17;
  _func_int **pp_Var18;
  byte bVar19;
  bool builtIn;
  TSymbol *symbol;
  TShaderQualifiers *local_70;
  TSourceLoc *local_68;
  pool_allocator<char> local_60;
  TString local_58;
  
  bVar5 = builtInName(this,identifier);
  if (!bVar5) {
    return (TSymbol *)0x0;
  }
  pTVar4 = (this->super_TParseContextBase).symbolTable;
  if (((long)(pTVar4->table).
             super__Vector_base<glslang::TSymbolTableLevel_*,_std::allocator<glslang::TSymbolTableLevel_*>_>
             ._M_impl.super__Vector_impl_data._M_finish -
       (long)(pTVar4->table).
             super__Vector_base<glslang::TSymbolTableLevel_*,_std::allocator<glslang::TSymbolTableLevel_*>_>
             ._M_impl.super__Vector_impl_data._M_start & 0x7fffffff8U) != 0x20) {
    return (TSymbol *)0x0;
  }
  local_70 = publicType;
  local_68 = loc;
  if ((this->super_TParseContextBase).super_TParseVersions.profile == EEsProfile) {
    bVar5 = false;
LAB_003a4e0b:
    bVar19 = 1;
    if ((this->super_TParseContextBase).super_TParseVersions.version < 0x140) {
      iVar9 = (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[9])
                        (this,2,AEP_shader_io_blocks);
      bVar19 = (byte)iVar9;
LAB_003a4e64:
      if ((bVar5 | bVar19) != 1) {
        return (TSymbol *)0x0;
      }
      goto LAB_003a4e71;
    }
LAB_003a4ef8:
    bVar7 = std::operator==(identifier,"gl_FragDepth");
    if ((((((bVar7) &&
           ((0x1a3 < (this->super_TParseContextBase).super_TParseVersions.version & bVar5) != 0 ||
            bVar19 != 0)) ||
          ((bVar7 = std::operator==(identifier,"gl_FragCoord"), bVar7 &&
           (bVar19 != 0 ||
            (0x8b < (this->super_TParseContextBase).super_TParseVersions.version & bVar5) != 0))))
         || ((((((bVar7 = std::operator==(identifier,"gl_ClipDistance"), bVar7 ||
                 (bVar7 = std::operator==(identifier,"gl_CullDistance"), bVar7)) ||
                (bVar7 = std::operator==(identifier,"gl_ShadingRateEXT"), bVar7)) ||
               ((bVar7 = std::operator==(identifier,"gl_PrimitiveShadingRateEXT"), bVar7 ||
                (bVar7 = std::operator==(identifier,"gl_FrontColor"), bVar7)))) ||
              (bVar7 = std::operator==(identifier,"gl_BackColor"), bVar7)) ||
             (((bVar7 = std::operator==(identifier,"gl_FrontSecondaryColor"), bVar7 ||
               (bVar7 = std::operator==(identifier,"gl_BackSecondaryColor"), bVar7)) ||
              ((bVar7 = std::operator==(identifier,"gl_SecondaryColor"), bVar7 ||
               ((bVar7 = std::operator==(identifier,"gl_Color"), bVar7 &&
                ((this->super_TParseContextBase).super_TParseVersions.language == EShLangFragment)))
               ))))))) ||
        ((bVar7 = std::operator==(identifier,"gl_FragStencilRefARB"), (bVar5 & bVar7) == 1 &&
         ((0x8b < (this->super_TParseContextBase).super_TParseVersions.version &&
          ((this->super_TParseContextBase).super_TParseVersions.language == EShLangFragment)))))) ||
       (((bVar5 = std::operator==(identifier,"gl_SampleMask"), bVar5 ||
         (((bVar5 = std::operator==(identifier,"gl_Layer"), bVar5 ||
           (bVar5 = std::operator==(identifier,"gl_PrimitiveIndicesNV"), bVar5)) ||
          (bVar5 = std::operator==(identifier,"gl_PrimitivePointIndicesEXT"), bVar5)))) ||
        ((bVar5 = std::operator==(identifier,"gl_PrimitiveLineIndicesEXT"), bVar5 ||
         (bVar5 = std::operator==(identifier,"gl_PrimitiveTriangleIndicesEXT"), bVar5)))))) {
      bVar7 = false;
    }
    else {
      bVar5 = std::operator==(identifier,"gl_TexCoord");
      bVar7 = false;
      if (!bVar5) {
        return (TSymbol *)0x0;
      }
    }
  }
  else {
    if ((this->super_TParseContextBase).super_TParseVersions.version < 0x82) {
      bVar5 = std::operator==(identifier,"gl_TexCoord");
      if ((this->super_TParseContextBase).super_TParseVersions.profile == EEsProfile)
      goto LAB_003a4e0b;
      bVar19 = 0;
      goto LAB_003a4e64;
    }
    bVar5 = true;
    bVar19 = 0;
LAB_003a4e71:
    if ((((this->super_TParseContextBase).super_TParseVersions.profile == EEsProfile) ||
        (0x8c < (this->super_TParseContextBase).super_TParseVersions.version)) ||
       (iVar9 = (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[8])
                          (this,"GL_ARB_separate_shader_objects"), (char)iVar9 == '\0'))
    goto LAB_003a4ef8;
    bVar6 = std::operator==(identifier,"gl_Position");
    bVar7 = true;
    if (((!bVar6) && (bVar6 = std::operator==(identifier,"gl_PointSize"), !bVar6)) &&
       ((bVar6 = std::operator==(identifier,"gl_ClipVertex"), !bVar6 &&
        (bVar6 = std::operator==(identifier,"gl_FogFragCoord"), !bVar6)))) goto LAB_003a4ef8;
  }
  symbol = TSymbolTable::find((this->super_TParseContextBase).symbolTable,identifier,&builtIn,
                              (bool *)0x0,(int *)0x0);
  if (symbol == (TSymbol *)0x0) {
    return (TSymbol *)0x0;
  }
  if (builtIn == true) {
    (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x4e])(this,&symbol)
    ;
    TSymbolTable::amendSymbolIdLevel((this->super_TParseContextBase).symbolTable,symbol);
  }
  iVar9 = (*symbol->_vptr_TSymbol[0xd])(symbol);
  lVar10 = (**(code **)(*(long *)CONCAT44(extraout_var,iVar9) + 0x50))
                     ((long *)CONCAT44(extraout_var,iVar9));
  if (bVar7) {
    bVar5 = TIntermediate::inIoAccessed
                      ((this->super_TParseContextBase).super_TParseVersions.intermediate,identifier)
    ;
    pTVar16 = local_68;
    if (bVar5) {
      (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
                (this,local_68,"cannot redeclare after use",(identifier->_M_dataplus)._M_p,"");
    }
    bVar5 = TQualifier::hasLayout(qualifier);
    if (bVar5) {
      iVar9 = (*symbol->_vptr_TSymbol[3])();
      (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
                (this,pTVar16,"cannot apply layout qualifier to","redeclaration",
                 *(undefined8 *)(CONCAT44(extraout_var_00,iVar9) + 8));
    }
    uVar14 = *(ulong *)&qualifier->field_0x8;
    if ((uVar14 & 0x3fff18020000000) == 0) {
      EVar1 = (this->super_TParseContextBase).super_TParseVersions.language;
      if (EVar1 == EShLangFragment) {
        if (((uint)uVar14 & 0x7f) != 3) goto LAB_003a51d3;
      }
      else if ((EVar1 == EShLangVertex) && (((uint)uVar14 & 0x7f) != 4)) goto LAB_003a51d3;
    }
    else {
LAB_003a51d3:
      iVar9 = (*symbol->_vptr_TSymbol[3])();
      (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
                (this,pTVar16,"cannot change storage, memory, or auxiliary qualification of",
                 "redeclaration",*(undefined8 *)(CONCAT44(extraout_var_01,iVar9) + 8));
      uVar14 = *(ulong *)&qualifier->field_0x8;
    }
    if (((uint)uVar14 >> 0x1e & 1) != 0) {
      return symbol;
    }
    iVar9 = (*symbol->_vptr_TSymbol[3])();
    uVar17 = *(undefined8 *)(CONCAT44(extraout_var_02,iVar9) + 8);
    pp_Var18 = (this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions;
    pcVar15 = "cannot change interpolation qualification of";
    goto LAB_003a5399;
  }
  bVar5 = std::operator==(identifier,"gl_FrontColor");
  pTVar16 = local_68;
  if ((((bVar5) || (bVar5 = std::operator==(identifier,"gl_BackColor"), bVar5)) ||
      (bVar5 = std::operator==(identifier,"gl_FrontSecondaryColor"), bVar5)) ||
     (((bVar5 = std::operator==(identifier,"gl_BackSecondaryColor"), bVar5 ||
       (bVar5 = std::operator==(identifier,"gl_SecondaryColor"), bVar5)) ||
      (bVar5 = std::operator==(identifier,"gl_Color"), bVar5)))) {
    uVar12 = (ulong)((uint)*(undefined8 *)&qualifier->field_0x8 & 0x80000000);
    uVar14 = *(ulong *)(lVar10 + 8);
    *(ulong *)(lVar10 + 8) = uVar14 & 0xffffffff7fffffff | uVar12;
    uVar11 = (ulong)((uint)*(undefined8 *)&qualifier->field_0x8 & 0x40000000);
    *(ulong *)(lVar10 + 8) = uVar14 & 0xffffffff3fffffff | uVar12 | uVar11;
    *(ulong *)(lVar10 + 8) =
         uVar14 & 0xffffffdf3fffffff | uVar12 | uVar11 |
         *(ulong *)&qualifier->field_0x8 & 0x2000000000;
    bVar5 = TQualifier::hasLayout(qualifier);
    if (bVar5) {
      iVar9 = (*symbol->_vptr_TSymbol[3])();
      (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
                (this,pTVar16,"cannot apply layout qualifier to","redeclaration",
                 *(undefined8 *)(CONCAT44(extraout_var_03,iVar9) + 8));
    }
    if ((*(ulong *)&qualifier->field_0x8 & 0x3fff18020000000) == 0) {
      iVar9 = (*symbol->_vptr_TSymbol[0xc])();
      lVar10 = (**(code **)(*(long *)CONCAT44(extraout_var_04,iVar9) + 0x58))
                         ((long *)CONCAT44(extraout_var_04,iVar9));
      if (((*(uint *)&qualifier->field_0x8 ^ *(uint *)(lVar10 + 8)) & 0x7f) == 0) {
        return symbol;
      }
    }
    iVar9 = (*symbol->_vptr_TSymbol[3])();
    uVar17 = *(undefined8 *)(CONCAT44(extraout_var_05,iVar9) + 8);
    pp_Var18 = (this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions;
    pcVar15 = "cannot change storage, memory, or auxiliary qualification of";
    goto LAB_003a5399;
  }
  bVar5 = std::operator==(identifier,"gl_TexCoord");
  if (((bVar5) || (bVar5 = std::operator==(identifier,"gl_ClipDistance"), bVar5)) ||
     (bVar5 = std::operator==(identifier,"gl_CullDistance"), bVar5)) {
    bVar5 = TQualifier::hasLayout(qualifier);
    if ((!bVar5) && (uVar14 = *(ulong *)&qualifier->field_0x8, (uVar14 & 0x3fff18020000000) == 0)) {
      uVar12 = *(ulong *)(lVar10 + 8) ^ uVar14;
      if (((uVar12 >> 0x25 & 1) == 0) &&
         (-1 < (int)*(ulong *)(lVar10 + 8) != (int)uVar14 < 0 && (uVar12 & 0x7f) == 0)) {
        return symbol;
      }
    }
    iVar9 = (*symbol->_vptr_TSymbol[3])();
    uVar17 = *(undefined8 *)(CONCAT44(extraout_var_06,iVar9) + 8);
    pp_Var18 = (this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions;
    pcVar15 = "cannot change qualification of";
    goto LAB_003a5399;
  }
  bVar5 = std::operator==(identifier,"gl_FragCoord");
  if (bVar5) {
    pTVar13 = (this->super_TParseContextBase).super_TParseVersions.intermediate;
    if (pTVar13->texCoordBuiltinRedeclared != true) {
      local_60.allocator = GetThreadPoolAllocator();
      std::__cxx11::basic_string<char,std::char_traits<char>,glslang::std::allocator<char>>::
      basic_string<glslang::std::allocator<char>>
                ((basic_string<char,std::char_traits<char>,glslang::std::allocator<char>> *)
                 &local_58,"gl_FragCoord",&local_60);
      bVar5 = TIntermediate::inIoAccessed(pTVar13,&local_58);
      if (bVar5) {
        (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
                  (this,pTVar16,"cannot redeclare after use","gl_FragCoord","");
      }
    }
    uVar14 = *(ulong *)&qualifier->field_0x8;
    if (((*(ulong *)(lVar10 + 8) ^ uVar14) >> 0x25 & 1) == 0) {
      if (((uVar14 & 0x3fff18020000000) == 0) &&
         ((int)uVar14 < 0 == (int)*(ulong *)(lVar10 + 8) < 0)) goto LAB_003a5563;
    }
    iVar9 = (*symbol->_vptr_TSymbol[3])();
    (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
              (this,pTVar16,"can only change layout qualification of","redeclaration",
               *(undefined8 *)(CONCAT44(extraout_var_07,iVar9) + 8));
    uVar14 = *(ulong *)&qualifier->field_0x8;
LAB_003a5563:
    if (((uint)uVar14 & 0x7f) != 3) {
      iVar9 = (*symbol->_vptr_TSymbol[3])();
      (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
                (this,pTVar16,"cannot change input storage qualification of","redeclaration",
                 *(undefined8 *)(CONCAT44(extraout_var_08,iVar9) + 8));
    }
    pTVar13 = (this->super_TParseContextBase).super_TParseVersions.intermediate;
    if ((builtIn == false) &&
       ((local_70->pixelCenterInteger != pTVar13->pixelCenterInteger ||
        (local_70->originUpperLeft != pTVar13->originUpperLeft)))) {
      iVar9 = (*symbol->_vptr_TSymbol[3])();
      (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
                (this,pTVar16,"cannot redeclare with different qualification:","redeclaration",
                 *(undefined8 *)(CONCAT44(extraout_var_09,iVar9) + 8));
      pTVar13 = (this->super_TParseContextBase).super_TParseVersions.intermediate;
    }
    pTVar13->texCoordBuiltinRedeclared = true;
    if (local_70->pixelCenterInteger == true) {
      pTVar13->pixelCenterInteger = true;
    }
    if (local_70->originUpperLeft == true) {
      pTVar13->originUpperLeft = true;
      return symbol;
    }
    return symbol;
  }
  bVar5 = std::operator==(identifier,"gl_FragDepth");
  if (!bVar5) {
    bVar5 = std::operator==(identifier,"gl_FragStencilRefARB");
    if (!bVar5) {
      bVar5 = std::operator==(identifier,"gl_PrimitiveIndicesNV");
      if (!bVar5) {
        bVar5 = std::operator==(identifier,"gl_SampleMask");
        if (bVar5) {
          if (local_70->layoutOverrideCoverage == false) {
            iVar9 = (*symbol->_vptr_TSymbol[3])();
            (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
                      (this,pTVar16,"redeclaration only allowed for override_coverage layout",
                       "redeclaration",*(undefined8 *)(CONCAT44(extraout_var_18,iVar9) + 8));
          }
          ((this->super_TParseContextBase).super_TParseVersions.intermediate)->
          layoutOverrideCoverage = true;
          return symbol;
        }
        bVar5 = std::operator==(identifier,"gl_Layer");
        if (bVar5) {
          cVar8 = qualifier->layoutViewportRelative;
          iVar9 = qualifier->layoutSecondaryViewportRelativeOffset;
          if (iVar9 == -0x800 && (bool)cVar8 == false) {
            iVar9 = (*symbol->_vptr_TSymbol[3])();
            (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
                      (this,pTVar16,
                       "redeclaration only allowed for viewport_relative or secondary_view_offset layout"
                       ,"redeclaration",*(undefined8 *)(CONCAT44(extraout_var_19,iVar9) + 8));
            cVar8 = qualifier->layoutViewportRelative;
            iVar9 = qualifier->layoutSecondaryViewportRelativeOffset;
          }
          *(char *)(lVar10 + 0x30) = cVar8;
          *(int *)(lVar10 + 0x34) = iVar9;
          return symbol;
        }
        return symbol;
      }
      bVar5 = TQualifier::hasLayout(qualifier);
      if (bVar5) {
        iVar9 = (*symbol->_vptr_TSymbol[3])();
        (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
                  (this,pTVar16,"cannot apply layout qualifier to","redeclaration",
                   *(undefined8 *)(CONCAT44(extraout_var_16,iVar9) + 8));
      }
      if ((*(uint *)&qualifier->field_0x8 & 0x7f) == 4) {
        return symbol;
      }
      iVar9 = (*symbol->_vptr_TSymbol[3])();
      uVar17 = *(undefined8 *)(CONCAT44(extraout_var_17,iVar9) + 8);
      pp_Var18 = (this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions;
      pcVar15 = "cannot change output storage qualification of";
      goto LAB_003a5399;
    }
    uVar14 = *(ulong *)&qualifier->field_0x8;
    if (((*(ulong *)(lVar10 + 8) ^ uVar14) >> 0x25 & 1) == 0) {
      if (((uVar14 & 0x3fff18020000000) != 0) ||
         ((int)uVar14 < 0 != (int)*(ulong *)(lVar10 + 8) < 0)) goto LAB_003a57d2;
    }
    else {
LAB_003a57d2:
      iVar9 = (*symbol->_vptr_TSymbol[3])();
      (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
                (this,pTVar16,"can only change layout qualification of","redeclaration",
                 *(undefined8 *)(CONCAT44(extraout_var_13,iVar9) + 8));
      uVar14 = *(ulong *)&qualifier->field_0x8;
    }
    if (((uint)uVar14 & 0x7f) != 4) {
      iVar9 = (*symbol->_vptr_TSymbol[3])();
      (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
                (this,pTVar16,"cannot change output storage qualification of","redeclaration",
                 *(undefined8 *)(CONCAT44(extraout_var_14,iVar9) + 8));
    }
    if (local_70->layoutStencil == ElsNone) {
      return symbol;
    }
    pTVar13 = (this->super_TParseContextBase).super_TParseVersions.intermediate;
    local_60.allocator = GetThreadPoolAllocator();
    std::__cxx11::basic_string<char,std::char_traits<char>,glslang::std::allocator<char>>::
    basic_string<glslang::std::allocator<char>>
              ((basic_string<char,std::char_traits<char>,glslang::std::allocator<char>> *)&local_58,
               "gl_FragStencilRefARB",&local_60);
    bVar5 = TIntermediate::inIoAccessed(pTVar13,&local_58);
    if (bVar5) {
      (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
                (this,pTVar16,"cannot redeclare after use","gl_FragStencilRefARB","");
    }
    pTVar13 = (this->super_TParseContextBase).super_TParseVersions.intermediate;
    TVar3 = pTVar13->stencilLayout;
    if (TVar3 == ElsNone) {
      pTVar13->stencilLayout = local_70->layoutStencil;
      return symbol;
    }
    if (TVar3 == local_70->layoutStencil) {
      return symbol;
    }
    iVar9 = (*symbol->_vptr_TSymbol[3])();
    uVar17 = *(undefined8 *)(CONCAT44(extraout_var_15,iVar9) + 8);
    pp_Var18 = (this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions;
    pcVar15 = "all redeclarations must use the same stencil layout on";
    goto LAB_003a5399;
  }
  uVar14 = *(ulong *)&qualifier->field_0x8;
  if (((*(ulong *)(lVar10 + 8) ^ uVar14) >> 0x25 & 1) == 0) {
    if (((uVar14 & 0x3fff18020000000) != 0) || ((int)uVar14 < 0 != (int)*(ulong *)(lVar10 + 8) < 0))
    goto LAB_003a5675;
  }
  else {
LAB_003a5675:
    iVar9 = (*symbol->_vptr_TSymbol[3])();
    (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
              (this,pTVar16,"can only change layout qualification of","redeclaration",
               *(undefined8 *)(CONCAT44(extraout_var_10,iVar9) + 8));
    uVar14 = *(ulong *)&qualifier->field_0x8;
  }
  if (((uint)uVar14 & 0x7f) != 4) {
    iVar9 = (*symbol->_vptr_TSymbol[3])();
    (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
              (this,pTVar16,"cannot change output storage qualification of","redeclaration",
               *(undefined8 *)(CONCAT44(extraout_var_11,iVar9) + 8));
  }
  if (local_70->layoutDepth == EldNone) {
    return symbol;
  }
  pTVar13 = (this->super_TParseContextBase).super_TParseVersions.intermediate;
  local_60.allocator = GetThreadPoolAllocator();
  std::__cxx11::basic_string<char,std::char_traits<char>,glslang::std::allocator<char>>::
  basic_string<glslang::std::allocator<char>>
            ((basic_string<char,std::char_traits<char>,glslang::std::allocator<char>> *)&local_58,
             "gl_FragDepth",&local_60);
  bVar5 = TIntermediate::inIoAccessed(pTVar13,&local_58);
  if (bVar5) {
    (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
              (this,pTVar16,"cannot redeclare after use","gl_FragDepth","");
  }
  pTVar13 = (this->super_TParseContextBase).super_TParseVersions.intermediate;
  TVar2 = pTVar13->depthLayout;
  if (TVar2 == EldNone) {
    pTVar13->depthLayout = local_70->layoutDepth;
    return symbol;
  }
  if (TVar2 == local_70->layoutDepth) {
    return symbol;
  }
  iVar9 = (*symbol->_vptr_TSymbol[3])();
  uVar17 = *(undefined8 *)(CONCAT44(extraout_var_12,iVar9) + 8);
  pp_Var18 = (this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions;
  pcVar15 = "all redeclarations must use the same depth layout on";
LAB_003a5399:
  (*pp_Var18[0x2d])(this,pTVar16,pcVar15,"redeclaration",uVar17);
  return symbol;
}

Assistant:

TSymbol* TParseContext::redeclareBuiltinVariable(const TSourceLoc& loc, const TString& identifier,
                                                 const TQualifier& qualifier, const TShaderQualifiers& publicType)
{
    if (! builtInName(identifier) || symbolTable.atBuiltInLevel() || ! symbolTable.atGlobalLevel())
        return nullptr;

    bool nonEsRedecls = (!isEsProfile() && (version >= 130 || identifier == "gl_TexCoord"));
    bool    esRedecls = (isEsProfile() &&
                         (version >= 320 || extensionsTurnedOn(Num_AEP_shader_io_blocks, AEP_shader_io_blocks)));
    if (! esRedecls && ! nonEsRedecls)
        return nullptr;

    // Special case when using GL_ARB_separate_shader_objects
    bool ssoPre150 = false;  // means the only reason this variable is redeclared is due to this combination
    if (!isEsProfile() && version <= 140 && extensionTurnedOn(E_GL_ARB_separate_shader_objects)) {
        if (identifier == "gl_Position"     ||
            identifier == "gl_PointSize"    ||
            identifier == "gl_ClipVertex"   ||
            identifier == "gl_FogFragCoord")
            ssoPre150 = true;
    }

    // Potentially redeclaring a built-in variable...

    if (ssoPre150 ||
        (identifier == "gl_FragDepth"           && ((nonEsRedecls && version >= 420) || esRedecls)) ||
        (identifier == "gl_FragCoord"           && ((nonEsRedecls && version >= 140) || esRedecls)) ||
         identifier == "gl_ClipDistance"                                                            ||
         identifier == "gl_CullDistance"                                                            ||
         identifier == "gl_ShadingRateEXT"                                                          ||
         identifier == "gl_PrimitiveShadingRateEXT"                                                 ||
         identifier == "gl_FrontColor"                                                              ||
         identifier == "gl_BackColor"                                                               ||
         identifier == "gl_FrontSecondaryColor"                                                     ||
         identifier == "gl_BackSecondaryColor"                                                      ||
         identifier == "gl_SecondaryColor"                                                          ||
        (identifier == "gl_Color"               && language == EShLangFragment)                     ||
        (identifier == "gl_FragStencilRefARB"   && (nonEsRedecls && version >= 140)
                                                && language == EShLangFragment)                     ||
         identifier == "gl_SampleMask"                                                              ||
         identifier == "gl_Layer"                                                                   ||
         identifier == "gl_PrimitiveIndicesNV"                                                      ||
         identifier == "gl_PrimitivePointIndicesEXT"                                                ||
         identifier == "gl_PrimitiveLineIndicesEXT"                                                 ||
         identifier == "gl_PrimitiveTriangleIndicesEXT"                                             ||
         identifier == "gl_TexCoord") {

        // Find the existing symbol, if any.
        bool builtIn;
        TSymbol* symbol = symbolTable.find(identifier, &builtIn);

        // If the symbol was not found, this must be a version/profile/stage
        // that doesn't have it.
        if (! symbol)
            return nullptr;

        // If it wasn't at a built-in level, then it's already been redeclared;
        // that is, this is a redeclaration of a redeclaration; reuse that initial
        // redeclaration.  Otherwise, make the new one.
        if (builtIn) {
            makeEditable(symbol);
            symbolTable.amendSymbolIdLevel(*symbol);
        }

        // Now, modify the type of the copy, as per the type of the current redeclaration.

        TQualifier& symbolQualifier = symbol->getWritableType().getQualifier();
        if (ssoPre150) {
            if (intermediate.inIoAccessed(identifier))
                error(loc, "cannot redeclare after use", identifier.c_str(), "");
            if (qualifier.hasLayout())
                error(loc, "cannot apply layout qualifier to", "redeclaration", symbol->getName().c_str());
            if (qualifier.isMemory() || qualifier.isAuxiliary() || (language == EShLangVertex   && qualifier.storage != EvqVaryingOut) ||
                                                                   (language == EShLangFragment && qualifier.storage != EvqVaryingIn))
                error(loc, "cannot change storage, memory, or auxiliary qualification of", "redeclaration", symbol->getName().c_str());
            if (! qualifier.smooth)
                error(loc, "cannot change interpolation qualification of", "redeclaration", symbol->getName().c_str());
        } else if (identifier == "gl_FrontColor"          ||
                   identifier == "gl_BackColor"           ||
                   identifier == "gl_FrontSecondaryColor" ||
                   identifier == "gl_BackSecondaryColor"  ||
                   identifier == "gl_SecondaryColor"      ||
                   identifier == "gl_Color") {
            symbolQualifier.flat = qualifier.flat;
            symbolQualifier.smooth = qualifier.smooth;
            symbolQualifier.nopersp = qualifier.nopersp;
            if (qualifier.hasLayout())
                error(loc, "cannot apply layout qualifier to", "redeclaration", symbol->getName().c_str());
            if (qualifier.isMemory() || qualifier.isAuxiliary() || symbol->getType().getQualifier().storage != qualifier.storage)
                error(loc, "cannot change storage, memory, or auxiliary qualification of", "redeclaration", symbol->getName().c_str());
        } else if (identifier == "gl_TexCoord"     ||
                   identifier == "gl_ClipDistance" ||
                   identifier == "gl_CullDistance") {
            if (qualifier.hasLayout() || qualifier.isMemory() || qualifier.isAuxiliary() ||
                qualifier.nopersp != symbolQualifier.nopersp || qualifier.flat != symbolQualifier.flat ||
                symbolQualifier.storage != qualifier.storage)
                error(loc, "cannot change qualification of", "redeclaration", symbol->getName().c_str());
        } else if (identifier == "gl_FragCoord") {
            if (!intermediate.getTexCoordRedeclared() && intermediate.inIoAccessed("gl_FragCoord"))
                error(loc, "cannot redeclare after use", "gl_FragCoord", "");
            if (qualifier.nopersp != symbolQualifier.nopersp || qualifier.flat != symbolQualifier.flat ||
                qualifier.isMemory() || qualifier.isAuxiliary())
                error(loc, "can only change layout qualification of", "redeclaration", symbol->getName().c_str());
            if (qualifier.storage != EvqVaryingIn)
                error(loc, "cannot change input storage qualification of", "redeclaration", symbol->getName().c_str());
            if (! builtIn && (publicType.pixelCenterInteger != intermediate.getPixelCenterInteger() ||
                              publicType.originUpperLeft != intermediate.getOriginUpperLeft()))
                error(loc, "cannot redeclare with different qualification:", "redeclaration", symbol->getName().c_str());


            intermediate.setTexCoordRedeclared();
            if (publicType.pixelCenterInteger)
                intermediate.setPixelCenterInteger();
            if (publicType.originUpperLeft)
                intermediate.setOriginUpperLeft();
        } else if (identifier == "gl_FragDepth") {
            if (qualifier.nopersp != symbolQualifier.nopersp || qualifier.flat != symbolQualifier.flat ||
                qualifier.isMemory() || qualifier.isAuxiliary())
                error(loc, "can only change layout qualification of", "redeclaration", symbol->getName().c_str());
            if (qualifier.storage != EvqVaryingOut)
                error(loc, "cannot change output storage qualification of", "redeclaration", symbol->getName().c_str());
            if (publicType.layoutDepth != EldNone) {
                if (intermediate.inIoAccessed("gl_FragDepth"))
                    error(loc, "cannot redeclare after use", "gl_FragDepth", "");
                if (! intermediate.setDepth(publicType.layoutDepth))
                    error(loc, "all redeclarations must use the same depth layout on", "redeclaration", symbol->getName().c_str());
            }
        } else if (identifier == "gl_FragStencilRefARB") {
            if (qualifier.nopersp != symbolQualifier.nopersp || qualifier.flat != symbolQualifier.flat ||
                qualifier.isMemory() || qualifier.isAuxiliary())
                error(loc, "can only change layout qualification of", "redeclaration", symbol->getName().c_str());
            if (qualifier.storage != EvqVaryingOut)
                error(loc, "cannot change output storage qualification of", "redeclaration", symbol->getName().c_str());
            if (publicType.layoutStencil != ElsNone) {
                if (intermediate.inIoAccessed("gl_FragStencilRefARB"))
                    error(loc, "cannot redeclare after use", "gl_FragStencilRefARB", "");
                if (!intermediate.setStencil(publicType.layoutStencil))
                    error(loc, "all redeclarations must use the same stencil layout on", "redeclaration",
                          symbol->getName().c_str());
            }
        }
        else if (
            identifier == "gl_PrimitiveIndicesNV") {
            if (qualifier.hasLayout())
                error(loc, "cannot apply layout qualifier to", "redeclaration", symbol->getName().c_str());
            if (qualifier.storage != EvqVaryingOut)
                error(loc, "cannot change output storage qualification of", "redeclaration", symbol->getName().c_str());
        }
        else if (identifier == "gl_SampleMask") {
            if (!publicType.layoutOverrideCoverage) {
                error(loc, "redeclaration only allowed for override_coverage layout", "redeclaration", symbol->getName().c_str());
            }
            intermediate.setLayoutOverrideCoverage();
        }
        else if (identifier == "gl_Layer") {
            if (!qualifier.layoutViewportRelative && qualifier.layoutSecondaryViewportRelativeOffset == -2048)
                error(loc, "redeclaration only allowed for viewport_relative or secondary_view_offset layout", "redeclaration", symbol->getName().c_str());
            symbolQualifier.layoutViewportRelative = qualifier.layoutViewportRelative;
            symbolQualifier.layoutSecondaryViewportRelativeOffset = qualifier.layoutSecondaryViewportRelativeOffset;
        }

        // TODO: semantics quality: separate smooth from nothing declared, then use IsInterpolation for several tests above

        return symbol;
    }

    return nullptr;
}